

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O3

ImgClass * __thiscall Webcam::snap(ImgClass *__return_storage_ptr__,Webcam *this)

{
  int iVar1;
  size_t sVar2;
  uchar *__dest;
  int iVar3;
  
  isStreamMode = false;
  frame();
  sVar2 = jpgClean(imgBuffer[0].data,(long)imgBuffer[0].size);
  iVar3 = (int)sVar2;
  imgBuffer[0].size = iVar3;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->size = 0;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  iVar1 = -1;
  if (-1 < iVar3) {
    iVar1 = iVar3;
  }
  __dest = (uchar *)operator_new__((long)iVar1);
  __return_storage_ptr__->data = __dest;
  memcpy(__dest,imgBuffer[0].data,(long)iVar3);
  iVar1 = imgBuffer[0].height;
  __return_storage_ptr__->width = imgBuffer[0].width;
  __return_storage_ptr__->height = iVar1;
  __return_storage_ptr__->size = iVar3;
  return __return_storage_ptr__;
}

Assistant:

ImgClass Webcam::snap()
{
    isStreamMode = false;
    frame();
    imgBuffer[0].size = jpgClean(imgBuffer[0].data, imgBuffer[0].size);
    return ImgClass(imgBuffer[0]);
}